

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::initShips(Player *this)

{
  return;
}

Assistant:

void Player::initShips()
{
//    battleship = 0;
//    cruiser[0] = 0;
//    cruiser[1] = 0;
//    for(int i = 0; i < 3; i++)
//        destroyer[i] = 0;
//    for(int i = 0; i < 4; i++)
//        submarine[i] = 0;
}